

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseFunctionCall(Parser *this,FunctionMatch *match)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  __tuple_element_t<0UL,_tuple<FunctionSignaturePartType,_unsigned_long,_bool>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<FunctionSignaturePartType,_unsigned_long,_bool>_> *p_Var5;
  RuntimeID id;
  mapped_type *this_00;
  bool local_b1;
  RuntimeID local_a0;
  String local_98;
  size_t local_78;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_70;
  Symbol *local_68;
  size_t j;
  SymbolListCItr endSymbol;
  __tuple_element_t<1UL,_tuple<FunctionSignaturePartType,_unsigned_long,_bool>_> expressionSize;
  ulong local_40;
  size_t i;
  String libName;
  FunctionMatch *match_local;
  Parser *this_local;
  
  libName.field_2._8_8_ = match;
  if (match->signature == (FunctionSignature *)0x0) {
    __assert_fail("match.signature",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                  ,0x6c7,"void Jinx::Impl::Parser::ParseFunctionCall(const FunctionMatch &)");
  }
  CheckLibraryName_abi_cxx11_((String *)&i,this);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  if (!bVar1) {
    NextSymbol(this);
  }
  for (local_40 = 0;
      sVar2 = std::
              vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ::size((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      *)(libName.field_2._8_8_ + 8)), local_40 < sVar2; local_40 = local_40 + 1) {
    pvVar3 = std::
             vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
             ::operator[]((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           *)(libName.field_2._8_8_ + 8),local_40);
    p_Var4 = std::get<0ul,Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>(pvVar3);
    if (*p_Var4 == Name) {
      pvVar3 = std::
               vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ::operator[]((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                             *)(libName.field_2._8_8_ + 8),local_40);
      p_Var5 = std::get<1ul,Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>(pvVar3);
      if (*p_Var5 != 0) {
        NextSymbol(this);
      }
    }
    else {
      bVar1 = Accept(this,ParenOpen);
      if (bVar1) {
        ParseExpression(this);
        Expect(this,ParenClose,"Error parsing expression");
      }
      else {
        pvVar3 = std::
                 vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 ::operator[]((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                               *)(libName.field_2._8_8_ + 8),local_40);
        p_Var5 = std::get<1ul,Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>(pvVar3);
        endSymbol._M_current = (Symbol *)*p_Var5;
        j = (size_t)(this->m_currentSymbol)._M_current;
        local_68 = (Symbol *)0x0;
        while( true ) {
          local_b1 = false;
          if (local_68 < endSymbol._M_current) {
            local_70._M_current =
                 (Symbol *)
                 std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                           (this->m_symbolList);
            local_b1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                                   *)&j,&local_70);
          }
          if (local_b1 == false) break;
          __gnu_cxx::
          __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
          ::operator++((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                        *)&j);
          local_68 = (Symbol *)((long)&local_68->type + 1);
        }
        local_78 = j;
        ParseExpression(this,(SymbolListCItr)j);
      }
    }
  }
  EmitOpcode(this,CallFunc);
  id = FunctionSignature::GetId(*(FunctionSignature **)libName.field_2._8_8_);
  EmitId(this,id);
  FunctionSignature::GetName_abi_cxx11_(&local_98,*(FunctionSignature **)libName.field_2._8_8_);
  local_a0 = FunctionSignature::GetId(*(FunctionSignature **)libName.field_2._8_8_);
  this_00 = std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
            ::operator[](&this->m_idNameMap,&local_a0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
            (this_00,&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_98);
  ParseSubscriptGet(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  return;
}

Assistant:

inline_t void Parser::ParseFunctionCall(const FunctionMatch & match)
	{
		assert(match.signature);

		auto libName = CheckLibraryName();
		if (!libName.empty())
			NextSymbol();

		// Parse function components according to match data
		for (size_t i = 0; i < match.partData.size(); ++i)
		{
			if (std::get<0>(match.partData[i]) == FunctionSignaturePartType::Name)
			{
				// Check to make sure this isn't a skipped optional name part
				if (std::get<1>(match.partData[i]) != 0)
					NextSymbol();
			}
			else
			{
				if (Accept(SymbolType::ParenOpen))
				{
					ParseExpression();
					Expect(SymbolType::ParenClose, "Error parsing expression");
				}
				else
				{
					auto expressionSize = std::get<1>(match.partData[i]);
					auto endSymbol = m_currentSymbol;
					for (size_t j = 0; j < expressionSize && endSymbol != m_symbolList.end(); ++j)
						++endSymbol;
					ParseExpression(endSymbol);
				}
			}
		}

		// When finished validating the function and pushing parameters, call the function
		EmitOpcode(Opcode::CallFunc);
		EmitId(match.signature->GetId());
		m_idNameMap[match.signature->GetId()] = match.signature->GetName();

		// Check for post-function index operator
		ParseSubscriptGet();
	}